

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void apply_z(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z,uECC_Curve curve)

{
  uECC_word_t product [8];
  uECC_word_t t1 [4];
  uECC_word_t auStack_98 [8];
  uECC_word_t local_58 [5];
  
  uECC_vli_mult(auStack_98,Z,Z,curve->num_words);
  (*curve->mmod_fast)(local_58,auStack_98);
  uECC_vli_mult(auStack_98,X1,local_58,curve->num_words);
  (*curve->mmod_fast)(X1,auStack_98);
  uECC_vli_mult(auStack_98,local_58,Z,curve->num_words);
  (*curve->mmod_fast)(local_58,auStack_98);
  uECC_vli_mult(auStack_98,Y1,local_58,curve->num_words);
  (*curve->mmod_fast)(Y1,auStack_98);
  return;
}

Assistant:

static void apply_z(uECC_word_t * X1,
                    uECC_word_t * Y1,
                    const uECC_word_t * const Z,
                    uECC_Curve curve) {
    uECC_word_t t1[uECC_MAX_WORDS];

    uECC_vli_modSquare_fast(t1, Z, curve);    /* z^2 */
    uECC_vli_modMult_fast(X1, X1, t1, curve); /* x1 * z^2 */
    uECC_vli_modMult_fast(t1, t1, Z, curve);  /* z^3 */
    uECC_vli_modMult_fast(Y1, Y1, t1, curve); /* y1 * z^3 */
}